

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O2

void __thiscall ixxx::ansi::noenv::test_method(noenv *this)

{
  char *__s;
  bool caught;
  allocator<char> local_c0 [24];
  string s;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  
  caught = false;
  __s = getenv("DOESNOTEXISTNOTEXIST");
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,local_c0);
  std::__cxx11::string::~string((string *)&s);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x7c);
  s._M_string_length._0_1_ = 0;
  s._M_dataplus._M_p = "r\x10\x11";
  s.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  s.field_2._8_8_ = anon_var_dwarf_125a2;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_80 = "";
  local_c0[0] = (allocator<char>)0x1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&s,&local_88,0x7c,1,2,&caught,"caught",local_c0,"true");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( noenv )
    {
      bool caught = false;
      try {
        string s(ansi::getenv("DOESNOTEXISTNOTEXIST"));
      } catch (getenv_error &e) {
        caught = true;
        BOOST_CHECK(e.function() == Function::GETENV);
      }
      BOOST_CHECK_EQUAL(caught, true);
    }